

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O3

FieldBase * __thiscall FIX::FieldMap::getFieldRef(FieldMap *this,int tag)

{
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  _Var1;
  FieldNotFound *this_00;
  string local_48;
  
  _Var1 = lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                    (this,*(FieldBase **)(this + 8),*(FieldBase **)(this + 0x10),tag);
  if (_Var1._M_current != *(FieldBase **)(this + 0x10)) {
    return _Var1._M_current;
  }
  this_00 = (FieldNotFound *)__cxa_allocate_exception(0x58);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  FieldNotFound::FieldNotFound(this_00,tag,&local_48);
  __cxa_throw(this_00,&FieldNotFound::typeinfo,Exception::~Exception);
}

Assistant:

const FieldBase& getFieldRef( int tag )
  const EXCEPT ( FieldNotFound )
  {
    Fields::const_iterator iter = findTag( tag );
    if ( iter == m_fields.end() )
      throw FieldNotFound( tag );
    return (*iter);
  }